

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::(anonymous_namespace)::
     insertion_sort<pugi::xpath_node,pugi::impl::(anonymous_namespace)::document_order_comparator>
               (xpath_node *begin,xpath_node *end,document_order_comparator *pred)

{
  bool local_41;
  xml_attribute_struct *local_40;
  xpath_node *hole;
  xpath_node val;
  xpath_node *it;
  document_order_comparator *pred_local;
  xpath_node *end_local;
  xpath_node *begin_local;
  
  if (begin != end) {
    for (val._attribute._attr = (xml_attribute_struct *)(begin + 1);
        val._attribute._attr != (xml_attribute_struct *)end;
        val._attribute._attr = (xml_attribute_struct *)&(val._attribute._attr)->value) {
      hole = (xpath_node *)(val._attribute._attr)->header;
      val._node._root = (xml_node_struct *)(val._attribute._attr)->name;
      local_40 = val._attribute._attr;
      while( true ) {
        local_41 = false;
        if (begin < local_40) {
          local_41 = anon_unknown_0::document_order_comparator::operator()
                               (pred,(xpath_node *)&hole,
                                (xpath_node *)&local_40[-1].prev_attribute_c);
        }
        if (local_41 == false) break;
        ((xml_node *)&local_40->header)->_root = (xml_node_struct *)local_40[-1].prev_attribute_c;
        ((xml_attribute *)&local_40->name)->_attr = local_40[-1].next_attribute;
        local_40 = (xml_attribute_struct *)&local_40[-1].prev_attribute_c;
      }
      ((xml_node *)&local_40->header)->_root = (xml_node_struct *)hole;
      ((xml_attribute *)&local_40->name)->_attr = (xml_attribute_struct *)val._node._root;
    }
  }
  return;
}

Assistant:

PUGI_IMPL_FN void insertion_sort(T* begin, T* end, const Pred& pred)
	{
		if (begin == end)
			return;

		for (T* it = begin + 1; it != end; ++it)
		{
			T val = *it;
			T* hole = it;

			// move hole backwards
			while (hole > begin && pred(val, *(hole - 1)))
			{
				*hole = *(hole - 1);
				hole--;
			}

			// fill hole with element
			*hole = val;
		}
	}